

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O2

void __thiscall cmServer::WriteJsonObject(cmServer *this,Value *jsonValue,DebugInfo *debug)

{
  pointer puVar1;
  cmServer *rwlock;
  unique_ptr<cmConnection,_std::default_delete<cmConnection>_> *connection;
  pointer puVar2;
  shared_lock<cm::shared_mutex> lock;
  shared_lock<cm::shared_mutex> local_28;
  
  rwlock = (cmServer *)&(this->super_cmServerBase).ConnectionsMutex;
  local_28._mutex = (shared_mutex *)rwlock;
  uv_rwlock_rdlock((uv_rwlock_t *)rwlock);
  puVar1 = (this->super_cmServerBase).Connections.
           super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (this->super_cmServerBase).Connections.
                super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    WriteJsonObject(rwlock,(puVar2->_M_t).
                           super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>
                           .super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl,jsonValue,
                    debug);
  }
  ::cm::shared_lock<cm::shared_mutex>::~shared_lock(&local_28);
  return;
}

Assistant:

void cmServer::WriteJsonObject(const Json::Value& jsonValue,
                               const DebugInfo* debug) const
{
  cm::shared_lock<cm::shared_mutex> lock(ConnectionsMutex);
  for (auto& connection : this->Connections) {
    WriteJsonObject(connection.get(), jsonValue, debug);
  }
}